

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall HighsSymmetryDetection::createNode(HighsSymmetryDetection *this)

{
  pointer pNVar1;
  
  std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
  emplace_back<>(&this->nodeStack);
  pNVar1 = (this->nodeStack).
           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar1[-1].stackStart =
       (HighsInt)
       ((ulong)((long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start) >> 2);
  pNVar1[-1].certificateEnd =
       (HighsInt)
       ((ulong)((long)(this->currNodeCertificate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->currNodeCertificate).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  pNVar1[-1].targetCell = -1;
  pNVar1[-1].lastDistiguished = -1;
  return;
}

Assistant:

void HighsSymmetryDetection::createNode() {
  nodeStack.emplace_back();
  nodeStack.back().stackStart = cellCreationStack.size();
  nodeStack.back().certificateEnd = currNodeCertificate.size();
  nodeStack.back().targetCell = -1;
  nodeStack.back().lastDistiguished = -1;
}